

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data,HelicsBool value)

{
  char *pcVar1;
  SmallBuffer *this;
  size_t sVar2;
  int in_ESI;
  bad_alloc *anon_var_0;
  char *dataValue;
  SmallBuffer *ptr;
  HelicsDataBuffer in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  SmallBuffer *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int32_t local_4;
  
  this = getBuffer(in_stack_ffffffffffffff88);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == 0) {
      pcVar1 = "+0";
    }
    else {
      pcVar1 = "*1";
    }
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar1 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (allocator<char> *)in_stack_ffffffffffffffb0);
    helics::
    ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::convert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    sVar2 = helics::SmallBuffer::size(this);
    local_4 = (int32_t)sVar2;
  }
  return local_4;
}

Assistant:

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data, HelicsBool value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    const auto* dataValue = (value == HELICS_FALSE) ? "0" : "1";
    try {
        helics::ValueConverter<std::string>::convert(dataValue, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}